

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2closest_edge_query_base.h
# Opt level: O1

void __thiscall
S2ClosestEdgeQueryBase<S2MinDistance>::FindClosestEdgesInternal
          (S2ClosestEdgeQueryBase<S2MinDistance> *this,Target *target,Options *options)

{
  double dVar1;
  int32 iVar2;
  S1ChordAngle SVar3;
  undefined8 uVar4;
  bool bVar5;
  int iVar6;
  int iVar7;
  char *__function;
  byte bVar8;
  iterator iVar9;
  btree_set<int,_std::less<int>,_std::allocator<int>,_256> shape_ids;
  undefined1 local_98 [16];
  code *local_88;
  code *pcStack_80;
  btree<gtl::internal_btree::set_params<int,_std::less<int>,_std::allocator<int>,_256,_false>_>
  *local_70;
  double local_68;
  Result local_60;
  S1ChordAngle local_50;
  btree<gtl::internal_btree::set_params<int,_std::less<int>,_std::allocator<int>,_256,_false>_>
  local_48;
  
  this->target_ = target;
  this->options_ = options;
  gtl::
  dense_hashtable<s2shapeutil::ShapeEdgeId,_s2shapeutil::ShapeEdgeId,_s2shapeutil::ShapeEdgeIdHash,_gtl::dense_hash_set<s2shapeutil::ShapeEdgeId,_s2shapeutil::ShapeEdgeIdHash,_std::equal_to<s2shapeutil::ShapeEdgeId>,_std::allocator<s2shapeutil::ShapeEdgeId>_>::Identity,_gtl::dense_hash_set<s2shapeutil::ShapeEdgeId,_s2shapeutil::ShapeEdgeIdHash,_std::equal_to<s2shapeutil::ShapeEdgeId>,_std::allocator<s2shapeutil::ShapeEdgeId>_>::SetKey,_std::equal_to<s2shapeutil::ShapeEdgeId>,_std::allocator<s2shapeutil::ShapeEdgeId>_>
  ::clear(&(this->tested_edges_).rep);
  (this->distance_limit_).super_S1ChordAngle.length2_ =
       (options->max_distance_).super_S1ChordAngle.length2_;
  S1ChordAngle::S1ChordAngle((S1ChordAngle *)local_98,INFINITY);
  (this->result_singleton_).distance_.super_S1ChordAngle.length2_ = (double)local_98._0_8_;
  (this->result_singleton_).shape_id_ = -1;
  (this->result_singleton_).edge_id_ = -1;
  if ((this->result_vector_).
      super__Vector_base<S2ClosestEdgeQueryBase<S2MinDistance>::Result,_std::allocator<S2ClosestEdgeQueryBase<S2MinDistance>::Result>_>
      ._M_impl.super__Vector_impl_data._M_start ==
      (this->result_vector_).
      super__Vector_base<S2ClosestEdgeQueryBase<S2MinDistance>::Result,_std::allocator<S2ClosestEdgeQueryBase<S2MinDistance>::Result>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    if ((this->result_set_).
        super_btree_set_container<gtl::internal_btree::btree<gtl::internal_btree::set_params<S2ClosestEdgeQueryBase<S2MinDistance>::Result,_std::less<S2ClosestEdgeQueryBase<S2MinDistance>::Result>,_std::allocator<S2ClosestEdgeQueryBase<S2MinDistance>::Result>,_256,_false>_>_>
        .
        super_btree_container<gtl::internal_btree::btree<gtl::internal_btree::set_params<S2ClosestEdgeQueryBase<S2MinDistance>::Result,_std::less<S2ClosestEdgeQueryBase<S2MinDistance>::Result>,_std::allocator<S2ClosestEdgeQueryBase<S2MinDistance>::Result>,_256,_false>_>_>
        .tree_.size_ == 0) {
      iVar6 = (*target->_vptr_S2DistanceTarget[8])(target);
      if (-1 < iVar6) {
        dVar1 = (this->distance_limit_).super_S1ChordAngle.length2_;
        S1ChordAngle::S1ChordAngle((S1ChordAngle *)local_98,0.0);
        if ((dVar1 != (double)local_98._0_8_) || (NAN(dVar1) || NAN((double)local_98._0_8_))) {
          if (options->max_results_ == 0x7fffffff) {
            dVar1 = (options->max_distance_).super_S1ChordAngle.length2_;
            S1ChordAngle::S1ChordAngle((S1ChordAngle *)local_98,INFINITY);
            if ((dVar1 == (double)local_98._0_8_) && (!NAN(dVar1) && !NAN((double)local_98._0_8_)))
            {
              S2LogMessage::S2LogMessage
                        ((S2LogMessage *)local_98,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2closest_edge_query_base.h"
                         ,0x235,kWarning,(ostream *)&std::cerr);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_98._8_8_,
                         "Returning all edges (max_results/max_distance not set)",0x36);
              S2LogMessage::~S2LogMessage((S2LogMessage *)local_98);
            }
          }
          if (options->include_interiors_ == true) {
            local_98._0_8_ = &local_48;
            local_48.root_.
            super_CompressedTupleImpl<absl::container_internal::CompressedTuple<std::less<int>,_std::allocator<int>,_gtl::internal_btree::btree_node<gtl::internal_btree::set_params<int,_std::less<int>,_std::allocator<int>,_256,_false>_>_*>,_absl::integer_sequence<unsigned_long,_0UL,_1UL,_2UL>_>
            .
            super_Storage<absl::container_internal::CompressedTuple<std::less<int>,_std::allocator<int>,_gtl::internal_btree::btree_node<gtl::internal_btree::set_params<int,_std::less<int>,_std::allocator<int>,_256,_false>_>_*>,_2UL,_false>
            .value = (CompressedTupleImpl<absl::container_internal::CompressedTuple<std::less<int>,_std::allocator<int>,_gtl::internal_btree::btree_node<gtl::internal_btree::set_params<int,_std::less<int>,_std::allocator<int>,_256,_false>_>_*>,_absl::integer_sequence<unsigned_long,_0UL,_1UL,_2UL>_>
                      )(Storage<absl::container_internal::CompressedTuple<std::less<int>,_std::allocator<int>,_gtl::internal_btree::btree_node<gtl::internal_btree::set_params<int,_std::less<int>,_std::allocator<int>,_256,_false>_>_*>,_2UL,_false>
                        )0x0;
            local_48.rightmost_ = (node_type *)0x0;
            local_48.size_ = 0;
            pcStack_80 = std::
                         _Function_handler<bool_(S2Shape_*,_const_Vector3<double>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2closest_edge_query_base.h:571:18)>
                         ::_M_invoke;
            local_88 = std::
                       _Function_handler<bool_(S2Shape_*,_const_Vector3<double>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2closest_edge_query_base.h:571:18)>
                       ::_M_manager;
            local_98._8_8_ = options;
            (*target->_vptr_S2DistanceTarget[6])(target,this->index_);
            if (local_88 != (code *)0x0) {
              (*local_88)(local_98,local_98,3);
            }
            if (local_48.root_.
                super_CompressedTupleImpl<absl::container_internal::CompressedTuple<std::less<int>,_std::allocator<int>,_gtl::internal_btree::btree_node<gtl::internal_btree::set_params<int,_std::less<int>,_std::allocator<int>,_256,_false>_>_*>,_absl::integer_sequence<unsigned_long,_0UL,_1UL,_2UL>_>
                .
                super_Storage<absl::container_internal::CompressedTuple<std::less<int>,_std::allocator<int>,_gtl::internal_btree::btree_node<gtl::internal_btree::set_params<int,_std::less<int>,_std::allocator<int>,_256,_false>_>_*>,_2UL,_false>
                .value == (Storage<absl::container_internal::CompressedTuple<std::less<int>,_std::allocator<int>,_gtl::internal_btree::btree_node<gtl::internal_btree::set_params<int,_std::less<int>,_std::allocator<int>,_256,_false>_>_*>,_2UL,_false>
                           )0x0) {
              local_98._0_8_ =
                   (btree<gtl::internal_btree::set_params<int,_std::less<int>,_std::allocator<int>,_256,_false>_>
                    *)0x0;
            }
            else {
              if (((ulong)local_48.root_.
                          super_CompressedTupleImpl<absl::container_internal::CompressedTuple<std::less<int>,_std::allocator<int>,_gtl::internal_btree::btree_node<gtl::internal_btree::set_params<int,_std::less<int>,_std::allocator<int>,_256,_false>_>_*>,_absl::integer_sequence<unsigned_long,_0UL,_1UL,_2UL>_>
                          .
                          super_Storage<absl::container_internal::CompressedTuple<std::less<int>,_std::allocator<int>,_gtl::internal_btree::btree_node<gtl::internal_btree::set_params<int,_std::less<int>,_std::allocator<int>,_256,_false>_>_*>,_2UL,_false>
                          .value & 7) != 0) {
                __function = 
                "CopyConst<Char, ElementType<N>> *absl::container_internal::internal_layout::LayoutImpl<std::tuple<gtl::internal_btree::btree_node<gtl::internal_btree::set_params<int, std::less<int>, std::allocator<int>, 256, false>> *, unsigned char, gtl::internal_btree::set_params<int, std::less<int>, std::allocator<int>, 256, false>::slot_type, gtl::internal_btree::btree_node<gtl::internal_btree::set_params<int, std::less<int>, std::allocator<int>, 256, false>> *>, absl::integer_sequence<unsigned long, 0, 1, 2, 3>, absl::integer_sequence<unsigned long, 0, 1, 2, 3>>::Pointer(Char *) const [Elements = std::tuple<gtl::internal_btree::btree_node<gtl::internal_btree::set_params<int, std::less<int>, std::allocator<int>, 256, false>> *, unsigned char, gtl::internal_btree::set_params<int, std::less<int>, std::allocator<int>, 256, false>::slot_type, gtl::internal_btree::btree_node<gtl::internal_btree::set_params<int, std::less<int>, std::allocator<int>, 256, false>> *>, SizeSeq = absl::integer_sequence<unsigned long, 0, 1, 2, 3>, OffsetSeq = absl::integer_sequence<unsigned long, 0, 1, 2, 3>, N = 0UL, Char = const char]"
                ;
LAB_001b4563:
                __assert_fail("reinterpret_cast<uintptr_t>(p) % alignment == 0",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/third_party/absl/container/internal/layout.h"
                              ,0x1e1,__function);
              }
              local_98._0_8_ =
                   *(undefined8 *)
                    local_48.root_.
                    super_CompressedTupleImpl<absl::container_internal::CompressedTuple<std::less<int>,_std::allocator<int>,_gtl::internal_btree::btree_node<gtl::internal_btree::set_params<int,_std::less<int>,_std::allocator<int>,_256,_false>_>_*>,_absl::integer_sequence<unsigned_long,_0UL,_1UL,_2UL>_>
                    .
                    super_Storage<absl::container_internal::CompressedTuple<std::less<int>,_std::allocator<int>,_gtl::internal_btree::btree_node<gtl::internal_btree::set_params<int,_std::less<int>,_std::allocator<int>,_256,_false>_>_*>,_2UL,_false>
                    .value;
            }
            local_98._8_8_ = local_98._8_8_ & 0xffffffff00000000;
            iVar9 = gtl::internal_btree::
                    btree<gtl::internal_btree::set_params<int,_std::less<int>,_std::allocator<int>,_256,_false>_>
                    ::end(&local_48);
            while (local_98._8_4_ != iVar9.position ||
                   (btree<gtl::internal_btree::set_params<int,_std::less<int>,_std::allocator<int>,_256,_false>_>
                    *)local_98._0_8_ !=
                   (btree<gtl::internal_btree::set_params<int,_std::less<int>,_std::allocator<int>,_256,_false>_>
                    *)iVar9.node) {
              if ((local_98._0_8_ & 7) != 0) {
                __function = 
                "CopyConst<Char, ElementType<N>> *absl::container_internal::internal_layout::LayoutImpl<std::tuple<gtl::internal_btree::btree_node<gtl::internal_btree::set_params<int, std::less<int>, std::allocator<int>, 256, false>> *, unsigned char, gtl::internal_btree::set_params<int, std::less<int>, std::allocator<int>, 256, false>::slot_type, gtl::internal_btree::btree_node<gtl::internal_btree::set_params<int, std::less<int>, std::allocator<int>, 256, false>> *>, absl::integer_sequence<unsigned long, 0, 1, 2, 3>, absl::integer_sequence<unsigned long, 0, 1, 2, 3>>::Pointer(Char *) const [Elements = std::tuple<gtl::internal_btree::btree_node<gtl::internal_btree::set_params<int, std::less<int>, std::allocator<int>, 256, false>> *, unsigned char, gtl::internal_btree::set_params<int, std::less<int>, std::allocator<int>, 256, false>::slot_type, gtl::internal_btree::btree_node<gtl::internal_btree::set_params<int, std::less<int>, std::allocator<int>, 256, false>> *>, SizeSeq = absl::integer_sequence<unsigned long, 0, 1, 2, 3>, OffsetSeq = absl::integer_sequence<unsigned long, 0, 1, 2, 3>, N = 2UL, Char = char]"
                ;
                goto LAB_001b4563;
              }
              iVar2 = *(int32 *)((undefined1 *)(local_98._0_8_ + 0xc) +
                                (long)(int)local_98._8_4_ * 4);
              S1ChordAngle::S1ChordAngle(&local_50,0.0);
              local_60.distance_.super_S1ChordAngle.length2_ =
                   (S1ChordAngle)(S1ChordAngle)local_50.length2_;
              local_60.edge_id_ = -1;
              local_60.shape_id_ = iVar2;
              AddResult(this,&local_60);
              gtl::internal_btree::
              btree_iterator<gtl::internal_btree::btree_node<gtl::internal_btree::set_params<int,_std::less<int>,_std::allocator<int>,_256,_false>_>,_int_&,_int_*>
              ::increment((btree_iterator<gtl::internal_btree::btree_node<gtl::internal_btree::set_params<int,_std::less<int>,_std::allocator<int>,_256,_false>_>,_int_&,_int_*>
                           *)local_98);
            }
            local_68 = (this->distance_limit_).super_S1ChordAngle.length2_;
            S1ChordAngle::S1ChordAngle((S1ChordAngle *)local_98,0.0);
            local_70 = (btree<gtl::internal_btree::set_params<int,_std::less<int>,_std::allocator<int>,_256,_false>_>
                        *)local_98._0_8_;
            gtl::internal_btree::
            btree<gtl::internal_btree::set_params<int,_std::less<int>,_std::allocator<int>,_256,_false>_>
            ::~btree(&local_48);
            if ((local_68 == (double)local_70) && (!NAN(local_68) && !NAN((double)local_70))) {
              return;
            }
          }
          dVar1 = (options->max_error_).length2_;
          S1ChordAngle::S1ChordAngle((S1ChordAngle *)local_98,0.0);
          if ((dVar1 != (double)local_98._0_8_) || (NAN(dVar1) || NAN((double)local_98._0_8_))) {
            local_98._0_8_ = (options->max_error_).length2_;
            iVar6 = (*this->target_->_vptr_S2DistanceTarget[7])();
            bVar8 = (byte)iVar6;
          }
          else {
            bVar8 = 0;
          }
          if (bVar8 == 0) {
            bVar5 = false;
          }
          else {
            dVar1 = (this->distance_limit_).super_S1ChordAngle.length2_;
            S1ChordAngle::S1ChordAngle((S1ChordAngle *)local_98,INFINITY);
            bVar5 = true;
            if ((dVar1 != (double)local_98._0_8_) || (NAN(dVar1) || NAN((double)local_98._0_8_))) {
              S1ChordAngle::S1ChordAngle((S1ChordAngle *)local_98,0.0);
              uVar4 = local_98._0_8_;
              SVar3 = operator-((this->distance_limit_).super_S1ChordAngle.length2_,
                                (options->max_error_).length2_);
              bVar5 = (double)uVar4 < SVar3.length2_;
            }
          }
          this->use_conservative_cell_distance_ = bVar5;
          iVar6 = (*this->target_->_vptr_S2DistanceTarget[8])();
          if ((this->index_num_edges_limit_ <= iVar6) &&
             (this->index_num_edges_limit_ <= this->index_num_edges_)) {
            iVar7 = s2shapeutil::CountEdgesUpTo<S2ShapeIndex>(this->index_,iVar6 + 1);
            this->index_num_edges_ = iVar7;
            this->index_num_edges_limit_ = iVar6 + 1;
          }
          if ((options->use_brute_force_ == false) && (iVar6 < this->index_num_edges_)) {
            this->avoid_duplicates_ = (bool)(bVar8 & 1 < options->max_results_);
            FindClosestEdgesOptimized(this);
          }
          else {
            this->avoid_duplicates_ = false;
            FindClosestEdgesBruteForce(this);
          }
        }
        return;
      }
      S2LogMessage::S2LogMessage
                ((S2LogMessage *)local_98,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2closest_edge_query_base.h"
                 ,0x230,kFatal,(ostream *)&std::cerr);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_98._8_8_,
                 "Check failed: (target->max_brute_force_index_size()) >= (0) ",0x3c);
    }
    else {
      S2LogMessage::S2LogMessage
                ((S2LogMessage *)local_98,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2closest_edge_query_base.h"
                 ,0x22f,kFatal,(ostream *)&std::cerr);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_98._8_8_,"Check failed: result_set_.empty() ",0x22);
    }
  }
  else {
    S2LogMessage::S2LogMessage
              ((S2LogMessage *)local_98,
               "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2closest_edge_query_base.h"
               ,0x22e,kFatal,(ostream *)&std::cerr);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_98._8_8_,"Check failed: result_vector_.empty() ",0x25);
  }
  abort();
}

Assistant:

void S2ClosestEdgeQueryBase<Distance>::FindClosestEdgesInternal(
    Target* target, const Options& options) {
  target_ = target;
  options_ = &options;

  tested_edges_.clear();
  distance_limit_ = options.max_distance();
  result_singleton_ = Result();
  S2_DCHECK(result_vector_.empty());
  S2_DCHECK(result_set_.empty());
  S2_DCHECK_GE(target->max_brute_force_index_size(), 0);
  if (distance_limit_ == Distance::Zero()) return;

  if (options.max_results() == Options::kMaxMaxResults &&
      options.max_distance() == Distance::Infinity()) {
    S2_LOG(WARNING) << "Returning all edges (max_results/max_distance not set)";
  }

  if (options.include_interiors()) {
    gtl::btree_set<int32> shape_ids;
    (void) target->VisitContainingShapes(
        *index_, [&shape_ids, &options](S2Shape* containing_shape,
                                        const S2Point& target_point) {
          shape_ids.insert(containing_shape->id());
          return shape_ids.size() < options.max_results();
        });
    for (int shape_id : shape_ids) {
      AddResult(Result(Distance::Zero(), shape_id, -1));
    }
    if (distance_limit_ == Distance::Zero()) return;
  }

  // If max_error() > 0 and the target takes advantage of this, then we may
  // need to adjust the distance estimates to the priority queue cells to
  // ensure that they are always a lower bound on the true distance.  For
  // example, suppose max_distance == 100, max_error == 30, and we compute the
  // distance to the target from some cell C0 as d(C0) == 80.  Then because
  // the target takes advantage of max_error(), the true distance could be as
  // low as 50.  In order not to miss edges contained by such cells, we need
  // to subtract max_error() from the distance estimates.  This behavior is
  // controlled by the use_conservative_cell_distance_ flag.
  //
  // However there is one important case where this adjustment is not
  // necessary, namely when max_distance() < max_error().  This is because
  // max_error() only affects the algorithm once at least max_results() edges
  // have been found that satisfy the given distance limit.  At that point,
  // max_error() is subtracted from distance_limit_ in order to ensure that
  // any further matches are closer by at least that amount.  But when
  // max_distance() < max_error(), this reduces the distance limit to 0,
  // i.e. all remaining candidate cells and edges can safely be discarded.
  // (Note that this is how IsDistanceLess() and friends are implemented.)
  //
  // Note that Distance::Delta only supports operator==.
  bool target_uses_max_error = (!(options.max_error() == Delta::Zero()) &&
                                target_->set_max_error(options.max_error()));

  // Note that we can't compare max_error() and distance_limit_ directly
  // because one is a Delta and one is a Distance.  Instead we subtract them.
  use_conservative_cell_distance_ = target_uses_max_error &&
      (distance_limit_ == Distance::Infinity() ||
       Distance::Zero() < distance_limit_ - options.max_error());

  // Use the brute force algorithm if the index is small enough.  To avoid
  // spending too much time counting edges when there are many shapes, we stop
  // counting once there are too many edges.  We may need to recount the edges
  // if we later see a target with a larger brute force edge threshold.
  int min_optimized_edges = target_->max_brute_force_index_size() + 1;
  if (min_optimized_edges > index_num_edges_limit_ &&
      index_num_edges_ >= index_num_edges_limit_) {
    index_num_edges_ = s2shapeutil::CountEdgesUpTo(*index_,
                                                   min_optimized_edges);
    index_num_edges_limit_ = min_optimized_edges;
  }

  if (options.use_brute_force() || index_num_edges_ < min_optimized_edges) {
    // The brute force algorithm considers each edge exactly once.
    avoid_duplicates_ = false;
    FindClosestEdgesBruteForce();
  } else {
    // If the target takes advantage of max_error() then we need to avoid
    // duplicate edges explicitly.  (Otherwise it happens automatically.)
    avoid_duplicates_ = (target_uses_max_error && options.max_results() > 1);
    FindClosestEdgesOptimized();
  }
}